

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O3

string * __thiscall
glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::
getTECode_abi_cxx11_
          (string *__return_storage_ptr__,
          TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this,
          _tessellation_primitive_mode primitive_mode)

{
  char *pcVar1;
  _Alloc_hider __s;
  ulong uVar2;
  string token;
  string primitive_mode_string;
  long *local_70;
  char *local_68;
  long local_60 [2];
  string local_50;
  
  TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
            (&local_50,(TessellationShaderUtils *)(ulong)primitive_mode,primitive_mode);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(PRIMITIVE_MODE) in;\n\nin TC_OUT\n{\n    int tc_invocation_id;\n    int tc_patch_vertices_in;\n    int tc_primitive_id;\n} in_tc[];\n\nout int te_tc_invocation_id;\nout int te_tc_patch_vertices_in;\nout int te_tc_primitive_id;\nout int te_patch_vertices_in;\nout int te_primitive_id;\n\nvoid main()\n{\n    te_tc_invocation_id     = in_tc[gl_PatchVerticesIn-1].tc_invocation_id;\n    te_tc_patch_vertices_in = in_tc[gl_PatchVerticesIn-1].tc_patch_vertices_in;\n    te_tc_primitive_id      = in_tc[gl_PatchVerticesIn-1].tc_primitive_id;\n    te_patch_vertices_in    = gl_PatchVerticesIn;\n    te_primitive_id         = gl_PrimitiveID;\n}"
             ,"");
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"PRIMITIVE_MODE","");
  uVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)local_70,0);
  pcVar1 = local_68;
  __s._M_p = local_50._M_dataplus._M_p;
  while (local_50._M_dataplus._M_p = __s._M_p, uVar2 != 0xffffffffffffffff) {
    local_68 = pcVar1;
    strlen(__s._M_p);
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar2,pcVar1,(ulong)__s._M_p);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)local_70,0);
    uVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)local_70,0);
    pcVar1 = local_68;
    __s._M_p = local_50._M_dataplus._M_p;
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::getTECode(
	_tessellation_primitive_mode primitive_mode)
{
	static const char* te_body = "${VERSION}\n"
								 "\n"
								 "${TESSELLATION_SHADER_REQUIRE}\n"
								 "\n"
								 "layout(PRIMITIVE_MODE) in;\n"
								 "\n"
								 "in TC_OUT\n"
								 "{\n"
								 "    int tc_invocation_id;\n"
								 "    int tc_patch_vertices_in;\n"
								 "    int tc_primitive_id;\n"
								 "} in_tc[];\n"
								 "\n"
								 "out int te_tc_invocation_id;\n"
								 "out int te_tc_patch_vertices_in;\n"
								 "out int te_tc_primitive_id;\n"
								 "out int te_patch_vertices_in;\n"
								 "out int te_primitive_id;\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "    te_tc_invocation_id     = in_tc[gl_PatchVerticesIn-1].tc_invocation_id;\n"
								 "    te_tc_patch_vertices_in = in_tc[gl_PatchVerticesIn-1].tc_patch_vertices_in;\n"
								 "    te_tc_primitive_id      = in_tc[gl_PatchVerticesIn-1].tc_primitive_id;\n"
								 "    te_patch_vertices_in    = gl_PatchVerticesIn;\n"
								 "    te_primitive_id         = gl_PrimitiveID;\n"
								 "}";

	/* Replace PRIMITIVE_MODE with user-provided value */
	std::string		  primitive_mode_string = TessellationShaderUtils::getESTokenForPrimitiveMode(primitive_mode);
	std::string		  result				= te_body;
	const std::string token					= "PRIMITIVE_MODE";
	std::size_t		  token_index			= std::string::npos;

	while ((token_index = result.find(token)) != std::string::npos)
	{
		result = result.replace(token_index, token.length(), primitive_mode_string.c_str());

		token_index = result.find(token);
	}

	return result;
}